

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::argument_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,Parameter *arg)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint32_t id;
  Dim DVar4;
  StorageClass SVar5;
  uint uVar6;
  BuiltIn builtin;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  uint32_t uVar10;
  int iVar11;
  ExecutionModel EVar12;
  SPIRVariable *pSVar13;
  SPIRType *pSVar14;
  undefined4 extraout_var;
  long *plVar15;
  size_type sVar16;
  undefined8 *puVar17;
  char *pcVar18;
  _Base_ptr p_Var19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  size_type *psVar20;
  char (*ts_1_00) [2];
  _Base_ptr p_Var21;
  _Alloc_hider _Var22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2;
  byte bVar23;
  undefined7 in_register_00000089;
  bool bVar24;
  bool bVar25;
  string *decl;
  string array_size_decl;
  uint32_t array_size;
  char *cv_qualifier;
  string address_space;
  string local_e8;
  SPIRType *local_c8;
  string local_c0;
  char *local_a0;
  ulong local_98;
  uint local_8c;
  string local_88;
  undefined8 local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  SPIRType *local_58;
  string local_50;
  
  pSVar13 = Variant::get<spirv_cross::SPIRVariable>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + (arg->id).id);
  local_c8 = Compiler::get_variable_data_type((Compiler *)this,pSVar13);
  local_58 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + (arg->type).id);
  bVar9 = local_58->pointer;
  bVar24 = arg->alias_global_variable;
  uVar10 = (pSVar13->super_IVariant).self.id;
  id = (pSVar13->basevariable).id;
  if (id == 0) {
    id = uVar10;
  }
  bVar25 = false;
  if ((bVar24 == false) && (bVar25 = false, id = uVar10, bVar9 != false)) {
    bVar25 = arg->write_count == 0;
  }
  local_98 = (ulong)local_58->storage;
  iVar11 = *(int *)&(local_c8->super_IVariant).field_0xc;
  DVar4 = (local_c8->image).dim;
  if ((DVar4 == DimSubpassData && iVar11 == 0x10) &&
     ((this->msl_options).use_framebuffer_fetch_subpasses != false)) {
    bVar25 = false;
  }
  else {
    bVar25 = (bool)(local_58->storage == StorageClassUniformConstant | bVar25);
  }
  local_8c = iVar11 - 0x13;
  local_a0 = "const ";
  if (!bVar25) {
    local_a0 = "";
  }
  if (0xfffffffc < local_8c) {
    local_a0 = "";
  }
  local_60 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_60;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar23 = ~bVar24;
  if (((DVar4 == Dim2D & iVar11 == 0x11 & bVar23) == 1) &&
     (pSVar14 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + (local_c8->image).type.id),
     *(int *)&(pSVar14->super_IVariant).field_0xc - 0xcU < 3)) {
    p_Var1 = &(this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header;
    p_Var21 = (this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_parent;
    p_Var19 = &p_Var1->_M_header;
    for (; p_Var21 != (_Base_ptr)0x0; p_Var21 = (&p_Var21->_M_left)[bVar24]) {
      bVar24 = (byte)(char)p_Var21[1]._M_color < 0x44;
      if (!bVar24) {
        p_Var19 = p_Var21;
      }
    }
    p_Var21 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var19 != p_Var1) &&
       (p_Var21 = p_Var19, 0x44 < (byte)(char)p_Var19[1]._M_color)) {
      p_Var21 = &p_Var1->_M_header;
    }
    bVar24 = (_Rb_tree_header *)p_Var21 != p_Var1;
  }
  else {
    bVar24 = false;
  }
  pSVar14 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr +
                       *(uint *)&(pSVar13->super_IVariant).field_0xc);
  ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  get_type_address_space_abi_cxx11_(&local_88,this,pSVar14,(pSVar13->super_IVariant).self.id,true);
  bVar25 = Compiler::has_decoration
                     ((Compiler *)this,(ID)(pSVar13->super_IVariant).self.id,DecorationBuiltIn);
  uVar10 = Compiler::get_decoration((Compiler *)this,(ID)(arg->id).id,DecorationBuiltIn);
  local_68 = CONCAT44(extraout_var,uVar10);
  iVar11 = ::std::__cxx11::string::compare((char *)&local_88);
  if (iVar11 == 0) {
    this->is_using_builtin_array = true;
  }
  uVar10 = (pSVar13->basevariable).id;
  if ((uVar10 == 0) ||
     ((uVar10 != (this->stage_in_ptr_var_id).id && (uVar10 != (this->stage_out_ptr_var_id).id)))) {
    if (bVar25) {
      pSVar14 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr +
                           *(uint *)&(pSVar13->super_IVariant).field_0xc);
      SVar5 = pSVar14->storage;
      builtin = (BuiltIn)local_68;
      if ((builtin - BuiltInTessLevelOuter < 2) && (SVar5 == StorageClassInput)) {
        bVar24 = false;
LAB_002ba8d5:
        this->is_using_builtin_array = bVar24;
      }
      else {
        bVar24 = true;
        if (builtin - BuiltInVertexId < 0xfffffffe) goto LAB_002ba8d5;
      }
      if (((SVar5 == StorageClassOutput) && ((this->capture_output_to_buffer & 1U) == 0)) &&
         (bVar24 = CompilerGLSL::is_stage_output_builtin_masked(&this->super_CompilerGLSL,builtin),
         !bVar24)) {
        this->is_using_builtin_array = true;
      }
      if (this->is_using_builtin_array == true) {
        uVar6 = (arg->id).id;
        ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar6;
        builtin_type_decl_abi_cxx11_(&local_c0,this,builtin,uVar6);
        join<char_const*&,std::__cxx11::string>
                  (&local_e8,(spirv_cross *)&local_a0,(char **)&local_c0,ts_1);
      }
      else {
        ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (ulong)(arg->id).id;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_c0,this,local_c8);
        join<char_const*&,std::__cxx11::string>
                  (&local_e8,(spirv_cross *)&local_a0,(char **)&local_c0,ts_1);
      }
      goto LAB_002baa25;
    }
    if ((((int)local_98 == 0xc) || ((int)local_98 == 2)) &&
       (bVar8 = Compiler::is_array((Compiler *)this,local_c8), bVar8)) {
      this->is_using_builtin_array = true;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&local_c0,this,local_c8,(ulong)(arg->id).id);
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x34eb6f;
      join<char_const*&,std::__cxx11::string,char_const(&)[2]>
                (&local_e8,(spirv_cross *)&local_a0,(char **)&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x34eb6f,
                 (char (*) [2])ts_2);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
      goto LAB_002baa3e;
    }
    if (bVar24) {
      pSVar14 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + (local_c8->image).type.id);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_c0,this,pSVar14,0);
      ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x34e815;
      join<char_const*&,char_const(&)[24],std::__cxx11::string,char_const(&)[2]>
                (&local_e8,(spirv_cross *)&local_a0,(char **)"spvDynamicImageSampler<",
                 (char (*) [24])&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x34e815,
                 (char (*) [2])CONCAT71(in_register_00000089,bVar23));
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      Compiler::set_extended_decoration
                ((Compiler *)this,(arg->id).id,SPIRVCrossDecorationDynamicImageSampler,0);
      goto LAB_002baa5b;
    }
    bVar24 = type_is_pointer(this,local_c8);
    if (!bVar24) {
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)(arg->id).id;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_c0,this,local_c8);
      join<char_const*&,std::__cxx11::string>
                (&local_e8,(spirv_cross *)&local_a0,(char **)&local_c0,ts_1);
      goto LAB_002baa25;
    }
    ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)(arg->id).id;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_e8,this,local_c8);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if (*local_a0 != '\0') {
      join<char_const(&)[2],char_const*&>
                (&local_e8,(spirv_cross *)0x348c37,(char (*) [2])&local_a0,(char **)ts_1);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
      _Var22._M_p = local_e8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p == &local_e8.field_2) goto LAB_002baa5b;
      goto LAB_002baa56;
    }
  }
  else {
    ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)(arg->id).id;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_c0,this,local_c8);
    join<char_const*&,std::__cxx11::string>
              (&local_e8,(spirv_cross *)&local_a0,(char **)&local_c0,ts_1);
LAB_002baa25:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e8);
LAB_002baa3e:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    _Var22._M_p = local_c0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
LAB_002baa56:
      operator_delete(_Var22._M_p);
    }
  }
LAB_002baa5b:
  if (((bVar9 & 1U) != 0 || bVar25) || ((int)local_98 - 9U < 0xfffffffe)) {
    bVar9 = Compiler::is_array((Compiler *)this,local_c8);
    uVar7 = local_68;
    uVar6 = local_8c;
    ts_1_00 = (char (*) [2])CONCAT71((int7)((ulong)ts_1 >> 8),0xfffffffc < local_8c);
    if (!bVar9 || 0xfffffffc < local_8c) {
      if (local_8c < 0xfffffffd) {
        local_e8._M_dataplus._M_p._0_4_ = (pSVar13->basevariable).id;
        sVar16 = ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count(&(this->pull_model_inputs)._M_h,(key_type *)&local_e8);
        if ((sVar16 == 0) || (*(int *)&(local_c8->super_IVariant).field_0xc == 0xf)) {
          if (local_88._M_string_length != 0) {
            bVar9 = type_is_pointer(this,local_c8);
            if (bVar9) {
              if (*local_a0 == '\0') {
                ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
              }
              join<std::__cxx11::string&,char_const(&)[2]>
                        (&local_e8,(spirv_cross *)&local_88,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x348c37,ts_1_00);
              ::std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
            }
            else {
              join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                        (&local_e8,(spirv_cross *)&local_88,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x348c37,(char (*) [2])__return_storage_ptr__,ts_2);
              ::std::__cxx11::string::operator=
                        ((string *)__return_storage_ptr__,(string *)&local_e8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p);
            }
          }
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          to_restrict(this,id,true);
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          CompilerGLSL::to_expression_abi_cxx11_(&local_e8,&this->super_CompilerGLSL,id,true);
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
          goto LAB_002bacc3;
        }
      }
      if (uVar6 < 0xfffffffd) {
        if (local_88._M_string_length != 0) {
          join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                    (&local_e8,(spirv_cross *)&local_88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x348c37,
                     (char (*) [2])__return_storage_ptr__,ts_2);
          ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        CompilerGLSL::to_expression_abi_cxx11_(&local_e8,&this->super_CompilerGLSL,id,true);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
      }
      else {
        if ((local_c8->array).super_VectorView<unsigned_int>.buffer_size != 0) {
          local_c0._M_dataplus._M_p =
               descriptor_address_space(this,id,(StorageClass)local_98,"thread const");
          join<char_const*&,char_const(&)[2],std::__cxx11::string&>
                    (&local_e8,(spirv_cross *)&local_c0,(char **)0x348c37,
                     (char (*) [2])__return_storage_ptr__,ts_2);
          ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          CompilerGLSL::to_expression_abi_cxx11_(&local_e8,&this->super_CompilerGLSL,id,true);
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
          goto LAB_002bb25e;
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        CompilerGLSL::to_expression_abi_cxx11_(&local_e8,&this->super_CompilerGLSL,id,true);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
      }
      goto LAB_002bacc3;
    }
    if (local_88._M_string_length != 0) {
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                (&local_e8,(spirv_cross *)&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x348c37,
                 (char (*) [2])__return_storage_ptr__,ts_2);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
    }
    pcVar18 = descriptor_address_space(this,id,(StorageClass)local_98,(char *)0x0);
    if (pcVar18 != (char *)0x0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    EVar12 = Compiler::get_execution_model((Compiler *)this);
    if ((!bVar25 || EVar12 != ExecutionModelTessellationControl) || 1 < (int)uVar7 - 0xbU) {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x25])(&local_e8,this,local_c8);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      pcVar18 = to_restrict(this,id,true);
      if (*pcVar18 != '\0') {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      CompilerGLSL::to_expression_abi_cxx11_(&local_c0,&this->super_CompilerGLSL,id,true);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_c0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      if (local_e8._M_string_length != 0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
      }
      goto LAB_002bacc3;
    }
    bVar9 = Compiler::is_tessellating_triangles((Compiler *)this);
    bVar24 = (int)uVar7 != 0xc;
    iVar11 = (uint)bVar24 * 2 + 2;
    if (bVar9) {
      iVar11 = (uint)bVar24 * 2 + 1;
    }
    local_c0._M_dataplus._M_p._0_4_ = iVar11;
    if (!bVar24 && bVar9) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      CompilerGLSL::to_expression_abi_cxx11_(&local_e8,&this->super_CompilerGLSL,id,true);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
      goto LAB_002bacc3;
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    CompilerGLSL::to_expression_abi_cxx11_(&local_e8,&this->super_CompilerGLSL,id,true);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
              (&local_e8,(spirv_cross *)0x3464bc,(char (*) [2])&local_c0,(uint *)0x33ea72,
               (char (*) [2])ts_2);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
LAB_002bb25e:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p == &local_e8.field_2) goto LAB_002bacd6;
  }
  else {
    if (((this->msl_options).force_native_arrays == true) &&
       (bVar9 = Compiler::is_array((Compiler *)this,local_c8), bVar9)) {
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"thread const ","");
      plVar15 = (long *)::std::__cxx11::string::_M_append
                                  ((char *)&local_c0,
                                   (ulong)(__return_storage_ptr__->_M_dataplus)._M_p);
      paVar2 = &local_e8.field_2;
      psVar20 = (size_type *)(plVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar20) {
        local_e8.field_2._M_allocated_capacity = *psVar20;
        local_e8.field_2._8_8_ = plVar15[3];
        local_e8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar20;
        local_e8._M_dataplus._M_p = (pointer)*plVar15;
      }
      local_e8._M_string_length = plVar15[1];
      *plVar15 = (long)psVar20;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      pcVar18 = to_restrict(this,id,true);
      if (*pcVar18 != '\0') {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      CompilerGLSL::to_expression_abi_cxx11_(&local_e8,&this->super_CompilerGLSL,id,true);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x25])(&local_e8,this,local_c8);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      goto LAB_002bacd6;
    }
    if (local_88._M_string_length != 0) {
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                (&local_e8,(spirv_cross *)&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x348c37,
                 (char (*) [2])__return_storage_ptr__,ts_2);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    CompilerGLSL::to_expression_abi_cxx11_(&local_e8,&this->super_CompilerGLSL,id,true);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
LAB_002bacc3:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p == &local_e8.field_2) goto LAB_002bacd6;
  }
  operator_delete(local_e8._M_dataplus._M_p);
LAB_002bacd6:
  pSVar13 = Compiler::maybe_get_backing_variable((Compiler *)this,id);
  if (pSVar13 != (SPIRVariable *)0x0) {
    local_e8._M_dataplus._M_p._0_4_ = (pSVar13->super_IVariant).self.id;
    sVar16 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count(&(this->atomic_image_vars)._M_h,(key_type *)&local_e8);
    if (sVar16 != 0) {
      pSVar14 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + (local_58->image).type.id);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_c0,this,pSVar14,0);
      plVar15 = (long *)::std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,0x35c9f7);
      paVar2 = &local_e8.field_2;
      psVar20 = (size_type *)(plVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar20) {
        local_e8.field_2._M_allocated_capacity = *psVar20;
        local_e8.field_2._8_8_ = plVar15[3];
        local_e8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar20;
        local_e8._M_dataplus._M_p = (pointer)*plVar15;
      }
      local_e8._M_string_length = plVar15[1];
      *plVar15 = (long)psVar20;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      paVar3 = &local_c0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar3) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,id,true);
      puVar17 = (undefined8 *)
                ::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x35f3b6);
      psVar20 = puVar17 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar17 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar20) {
        local_c0.field_2._M_allocated_capacity = *psVar20;
        local_c0.field_2._8_8_ = puVar17[3];
        local_c0._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_c0.field_2._M_allocated_capacity = *psVar20;
        local_c0._M_dataplus._M_p = (pointer)*puVar17;
      }
      local_c0._M_string_length = puVar17[1];
      *puVar17 = psVar20;
      puVar17[1] = 0;
      *(undefined1 *)(puVar17 + 2) = 0;
      puVar17 = (undefined8 *)::std::__cxx11::string::append((char *)&local_c0);
      psVar20 = puVar17 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar17 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar20) {
        local_e8.field_2._M_allocated_capacity = *psVar20;
        local_e8.field_2._8_8_ = puVar17[3];
        local_e8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar20;
        local_e8._M_dataplus._M_p = (pointer)*puVar17;
      }
      local_e8._M_string_length = puVar17[1];
      *puVar17 = psVar20;
      puVar17[1] = 0;
      *(undefined1 *)(puVar17 + 2) = 0;
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar3) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
  }
  this->is_using_builtin_array = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::argument_decl(const SPIRFunction::Parameter &arg)
{
	auto &var = get<SPIRVariable>(arg.id);
	auto &type = get_variable_data_type(var);
	auto &var_type = get<SPIRType>(arg.type);
	StorageClass type_storage = var_type.storage;
	bool is_pointer = var_type.pointer;

	// If we need to modify the name of the variable, make sure we use the original variable.
	// Our alias is just a shadow variable.
	uint32_t name_id = var.self;
	if (arg.alias_global_variable && var.basevariable)
		name_id = var.basevariable;

	bool constref = !arg.alias_global_variable && is_pointer && arg.write_count == 0;
	// Framebuffer fetch is plain value, const looks out of place, but it is not wrong.
	if (type_is_msl_framebuffer_fetch(type))
		constref = false;
	else if (type_storage == StorageClassUniformConstant)
		constref = true;

	bool type_is_image = type.basetype == SPIRType::Image || type.basetype == SPIRType::SampledImage ||
	                     type.basetype == SPIRType::Sampler;

	// For opaque types we handle const later due to descriptor address spaces.
	const char *cv_qualifier = (constref && !type_is_image) ? "const " : "";
	string decl;

	// If this is a combined image-sampler for a 2D image with floating-point type,
	// we emitted the 'spvDynamicImageSampler' type, and this is *not* an alias parameter
	// for a global, then we need to emit a "dynamic" combined image-sampler.
	// Unfortunately, this is necessary to properly support passing around
	// combined image-samplers with Y'CbCr conversions on them.
	bool is_dynamic_img_sampler = !arg.alias_global_variable && type.basetype == SPIRType::SampledImage &&
	                              type.image.dim == Dim2D && type_is_floating_point(get<SPIRType>(type.image.type)) &&
	                              spv_function_implementations.count(SPVFuncImplDynamicImageSampler);

	// Allow Metal to use the array<T> template to make arrays a value type
	string address_space = get_argument_address_space(var);
	bool builtin = has_decoration(var.self, DecorationBuiltIn);
	auto builtin_type = BuiltIn(get_decoration(arg.id, DecorationBuiltIn));

	if (address_space == "threadgroup")
		is_using_builtin_array = true;

	if (var.basevariable && (var.basevariable == stage_in_ptr_var_id || var.basevariable == stage_out_ptr_var_id))
		decl = join(cv_qualifier, type_to_glsl(type, arg.id));
	else if (builtin)
	{
		// Only use templated array for Clip/Cull distance when feasible.
		// In other scenarios, we need need to override array length for tess levels (if used as outputs),
		// or we need to emit the expected type for builtins (uint vs int).
		auto storage = get<SPIRType>(var.basetype).storage;

		if (storage == StorageClassInput &&
		    (builtin_type == BuiltInTessLevelInner || builtin_type == BuiltInTessLevelOuter))
		{
			is_using_builtin_array = false;
		}
		else if (builtin_type != BuiltInClipDistance && builtin_type != BuiltInCullDistance)
		{
			is_using_builtin_array = true;
		}

		if (storage == StorageClassOutput && variable_storage_requires_stage_io(storage) &&
		    !is_stage_output_builtin_masked(builtin_type))
			is_using_builtin_array = true;

		if (is_using_builtin_array)
			decl = join(cv_qualifier, builtin_type_decl(builtin_type, arg.id));
		else
			decl = join(cv_qualifier, type_to_glsl(type, arg.id));
	}
	else if ((type_storage == StorageClassUniform || type_storage == StorageClassStorageBuffer) && is_array(type))
	{
		is_using_builtin_array = true;
		decl += join(cv_qualifier, type_to_glsl(type, arg.id), "*");
	}
	else if (is_dynamic_img_sampler)
	{
		decl = join(cv_qualifier, "spvDynamicImageSampler<", type_to_glsl(get<SPIRType>(type.image.type)), ">");
		// Mark the variable so that we can handle passing it to another function.
		set_extended_decoration(arg.id, SPIRVCrossDecorationDynamicImageSampler);
	}
	else
	{
		// The type is a pointer type we need to emit cv_qualifier late.
		if (type_is_pointer(type))
		{
			decl = type_to_glsl(type, arg.id);
			if (*cv_qualifier != '\0')
				decl += join(" ", cv_qualifier);
		}
		else
			decl = join(cv_qualifier, type_to_glsl(type, arg.id));
	}

	if (!builtin && !is_pointer &&
	    (type_storage == StorageClassFunction || type_storage == StorageClassGeneric))
	{
		// If the argument is a pure value and not an opaque type, we will pass by value.
		if (msl_options.force_native_arrays && is_array(type))
		{
			// We are receiving an array by value. This is problematic.
			// We cannot be sure of the target address space since we are supposed to receive a copy,
			// but this is not possible with MSL without some extra work.
			// We will have to assume we're getting a reference in thread address space.
			// If we happen to get a reference in constant address space, the caller must emit a copy and pass that.
			// Thread const therefore becomes the only logical choice, since we cannot "create" a constant array from
			// non-constant arrays, but we can create thread const from constant.
			decl = string("thread const ") + decl;
			decl += " (&";
			const char *restrict_kw = to_restrict(name_id, true);
			if (*restrict_kw)
			{
				decl += " ";
				decl += restrict_kw;
			}
			decl += to_expression(name_id);
			decl += ")";
			decl += type_to_array_glsl(type);
		}
		else
		{
			if (!address_space.empty())
				decl = join(address_space, " ", decl);
			decl += " ";
			decl += to_expression(name_id);
		}
	}
	else if (is_array(type) && !type_is_image)
	{
		// Arrays of opaque types are special cased.
		if (!address_space.empty())
			decl = join(address_space, " ", decl);

		const char *argument_buffer_space = descriptor_address_space(name_id, type_storage, nullptr);
		if (argument_buffer_space)
		{
			decl += " ";
			decl += argument_buffer_space;
		}

		// Special case, need to override the array size here if we're using tess level as an argument.
		if (is_tesc_shader() && builtin &&
		    (builtin_type == BuiltInTessLevelInner || builtin_type == BuiltInTessLevelOuter))
		{
			uint32_t array_size = get_physical_tess_level_array_size(builtin_type);
			if (array_size == 1)
			{
				decl += " &";
				decl += to_expression(name_id);
			}
			else
			{
				decl += " (&";
				decl += to_expression(name_id);
				decl += ")";
				decl += join("[", array_size, "]");
			}
		}
		else
		{
			auto array_size_decl = type_to_array_glsl(type);
			if (array_size_decl.empty())
				decl += "& ";
			else
				decl += " (&";

			const char *restrict_kw = to_restrict(name_id, true);
			if (*restrict_kw)
			{
				decl += " ";
				decl += restrict_kw;
			}
			decl += to_expression(name_id);

			if (!array_size_decl.empty())
			{
				decl += ")";
				decl += array_size_decl;
			}
		}
	}
	else if (!type_is_image && (!pull_model_inputs.count(var.basevariable) || type.basetype == SPIRType::Struct))
	{
		// If this is going to be a reference to a variable pointer, the address space
		// for the reference has to go before the '&', but after the '*'.
		if (!address_space.empty())
		{
			if (type_is_pointer(type))
			{
				if (*cv_qualifier == '\0')
					decl += ' ';
				decl += join(address_space, " ");
			}
			else
				decl = join(address_space, " ", decl);
		}
		decl += "&";
		decl += " ";
		decl += to_restrict(name_id, true);
		decl += to_expression(name_id);
	}
	else if (type_is_image)
	{
		if (type.array.empty())
		{
			// For non-arrayed types we can just pass opaque descriptors by value.
			// This fixes problems if descriptors are passed by value from argument buffers and plain descriptors
			// in same shader.
			// There is no address space we can actually use, but value will work.
			// This will break if applications attempt to pass down descriptor arrays as arguments, but
			// fortunately that is extremely unlikely ...
			decl += " ";
			decl += to_expression(name_id);
		}
		else
		{
			const char *img_address_space = descriptor_address_space(name_id, type_storage, "thread const");
			decl = join(img_address_space, " ", decl);
			decl += "& ";
			decl += to_expression(name_id);
		}
	}
	else
	{
		if (!address_space.empty())
			decl = join(address_space, " ", decl);
		decl += " ";
		decl += to_expression(name_id);
	}

	// Emulate texture2D atomic operations
	auto *backing_var = maybe_get_backing_variable(name_id);
	if (backing_var && atomic_image_vars.count(backing_var->self))
	{
		decl += ", device atomic_" + type_to_glsl(get<SPIRType>(var_type.image.type), 0);
		decl += "* " + to_expression(name_id) + "_atomic";
	}

	is_using_builtin_array = false;

	return decl;
}